

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qapplication.cpp
# Opt level: O3

void __thiscall QApplicationPrivate::closePopup(QApplicationPrivate *this,QWidget *popup)

{
  QWidgetData *pQVar1;
  QDebug this_00;
  char cVar2;
  bool bVar3;
  QWindow *pQVar4;
  long lVar5;
  QWidget *pQVar6;
  undefined8 uVar7;
  QWidget *pQVar8;
  QWidgetPrivate *this_01;
  long in_FS_OFFSET;
  QByteArrayView QVar9;
  QDebug local_70;
  undefined1 local_68 [8];
  QArrayData *local_60 [3];
  undefined4 local_48;
  undefined4 uStack_44;
  undefined4 uStack_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  char *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  pQVar4 = QWidget::windowHandle(popup);
  if (pQVar4 != (QWindow *)0x0) {
    cVar2 = QGuiApplicationPrivate::closePopup(pQVar4);
    if (cVar2 != '\0') {
      lVar5 = QGuiApplicationPrivate::activePopupWindow();
      if (lVar5 == 0) {
        if (popupGrabOk == true) {
          popupGrabOk = false;
          if (active_window != (QWidget *)0x0) {
            pQVar4 = QWidget::windowHandle(active_window);
            if (pQVar4 != (QWindow *)0x0) {
              pQVar1 = popup->data;
              uVar7 = QGuiApplicationPrivate::QLastCursorPosition::toPoint();
              local_48 = (undefined4)uVar7;
              uStack_44 = (undefined4)((ulong)uVar7 >> 0x20);
              cVar2 = QRect::contains((QPoint *)&pQVar1->crect,SUB81(&local_48,0));
              if (cVar2 == '\0') {
                bVar3 = QWidget::testAttribute_helper(popup,WA_NoMouseReplay);
                if (!bVar3) {
                  replayMousePress = true;
                }
              }
            }
          }
          lcWidgetPopup();
          if (((byte)lcWidgetPopup::category.field_2.bools.enabledDebug._q_value._M_base._M_i & 1)
              != 0) {
            local_48 = 2;
            uStack_44 = 0;
            uStack_40 = 0;
            uStack_3c = 0;
            uStack_38 = 0;
            uStack_34 = 0;
            local_30 = lcWidgetPopup::category.name;
            QMessageLogger::debug();
            this_00.stream = local_70.stream;
            QVar9.m_data = (storage_type *)0x10;
            QVar9.m_size = (qsizetype)local_60;
            QString::fromUtf8(QVar9);
            QTextStream::operator<<((QTextStream *)this_00.stream,(QString *)local_60);
            if (local_60[0] != (QArrayData *)0x0) {
              LOCK();
              (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i =
                   (local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i + -1;
              UNLOCK();
              if ((local_60[0]->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
                QArrayData::deallocate(local_60[0],2,0x10);
              }
            }
            if (*(QTextStream *)(local_70.stream + 0x30) == (QTextStream)0x1) {
              QTextStream::operator<<((QTextStream *)local_70.stream,' ');
            }
            *(int *)((QTextStream *)local_70.stream + 0x28) =
                 *(int *)((QTextStream *)local_70.stream + 0x28) + 1;
            ::operator<<((Stream *)local_60,(QWidget *)local_68);
            QDebug::~QDebug((QDebug *)local_60);
            QDebug::~QDebug((QDebug *)local_68);
            QDebug::~QDebug(&local_70);
          }
          pQVar8 = QWidget::mouseGrabber();
          pQVar6 = popup;
          if (pQVar8 != (QWidget *)0x0) {
            pQVar6 = QWidget::mouseGrabber();
          }
          this_01 = qt_widget_private(pQVar6);
          QWidgetPrivate::stealMouseGrab(this_01,pQVar8 != (QWidget *)0x0);
          ungrabKeyboardForPopup(popup);
        }
        if (active_window != (QWidget *)0x0) {
          pQVar6 = QWidget::focusWidget(active_window);
          if (pQVar6 != (QWidget *)0x0) {
            if (pQVar6 == focus_widget) {
              uStack_38 = 0xaaaaaaaa;
              uStack_34 = 0xaaaaaaaa;
              local_48 = 0xaaaaaaaa;
              uStack_44 = 0xaaaaaaaa;
              uStack_40 = 0xaaaaaaaa;
              uStack_3c = 0xaaaaaaaa;
              QFocusEvent::QFocusEvent((QFocusEvent *)&local_48,FocusIn,PopupFocusReason);
              QCoreApplication::sendEvent(&pQVar6->super_QObject,(QEvent *)&local_48);
              QFocusEvent::~QFocusEvent((QFocusEvent *)&local_48);
            }
            else {
              QWidget::setFocus(pQVar6,PopupFocusReason);
            }
          }
        }
      }
      else {
        lVar5 = QMetaObject::cast((QObject *)&QWidgetWindow::staticMetaObject);
        if (lVar5 != 0) {
          pQVar6 = QWidget::focusWidget(*(QWidget **)(lVar5 + 0x30));
          if (pQVar6 != (QWidget *)0x0) {
            QWidget::setFocus(pQVar6,PopupFocusReason);
          }
          if (_operator>> == 1) {
            if ((*(long *)(lVar5 + 0x28) == 0) || (*(int *)(*(long *)(lVar5 + 0x28) + 4) == 0)) {
              pQVar6 = (QWidget *)0x0;
            }
            else {
              pQVar6 = *(QWidget **)(lVar5 + 0x30);
            }
            if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
              grabForPopup(pQVar6);
              return;
            }
            goto LAB_002c011c;
          }
        }
      }
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
LAB_002c011c:
  __stack_chk_fail();
}

Assistant:

void QApplicationPrivate::closePopup(QWidget *popup)
{
    QWindow *win = popup->windowHandle();
    if (!win)
        return;
    if (!QGuiApplicationPrivate::closePopup(win))
        return;

    const QWindow *nextRemainingPopup = QGuiApplicationPrivate::activePopupWindow();
    if (!nextRemainingPopup) { // this was the last popup

        if (popupGrabOk) {
            popupGrabOk = false;

            if (active_window && active_window->windowHandle()
                && !popup->geometry().contains(QGuiApplicationPrivate::lastCursorPosition.toPoint())
                && !popup->testAttribute(Qt::WA_NoMouseReplay)) {
                QApplicationPrivate::replayMousePress = true;
            }

            // transfer grab back to mouse grabber if any, otherwise release the grab
            ungrabMouseForPopup(popup);

            // transfer grab back to keyboard grabber if any, otherwise release the grab
            ungrabKeyboardForPopup(popup);
        }

        if (active_window) {
            if (QWidget *fw = active_window->focusWidget()) {
                if (fw != QApplication::focusWidget()) {
                    fw->setFocus(Qt::PopupFocusReason);
                } else {
                    QFocusEvent e(QEvent::FocusIn, Qt::PopupFocusReason);
                    QCoreApplication::sendEvent(fw, &e);
                }
            }
        }

    } else if (const auto *popupWin = qobject_cast<const QWidgetWindow *>(nextRemainingPopup)) {
        // A popup was closed, so the previous popup gets the focus.
        if (QWidget *fw = popupWin->widget()->focusWidget())
            fw->setFocus(Qt::PopupFocusReason);

        // can become nullptr due to setFocus() above
        if (QGuiApplicationPrivate::popupCount() == 1) // grab mouse/keyboard
            grabForPopup(popupWin->widget());
    }

}